

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O2

uint32_t __thiscall icu_63::CollationSettings::reorderEx(CollationSettings *this,uint32_t p)

{
  uint uVar1;
  uint *puVar2;
  
  if (p < this->minHighNoReorder) {
    puVar2 = this->reorderRanges;
    do {
      uVar1 = *puVar2;
      puVar2 = puVar2 + 1;
    } while (uVar1 <= (p | 0xffff));
    p = p + uVar1 * 0x1000000;
  }
  return p;
}

Assistant:

uint32_t
CollationSettings::reorderEx(uint32_t p) const {
    if(p >= minHighNoReorder) { return p; }
    // Round up p so that its lower 16 bits are >= any offset bits.
    // Then compare q directly with (limit, offset) pairs.
    uint32_t q = p | 0xffff;
    uint32_t r;
    const uint32_t *ranges = reorderRanges;
    while(q >= (r = *ranges)) { ++ranges; }
    return p + (r << 24);
}